

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

bam_hdr_t * sam_hdr_read(htsFile *fp)

{
  htsExactFormat hVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  bam_hdr_t *pbVar5;
  FILE *__stream;
  char *pcVar6;
  char *pcVar7;
  kstring_t local_858;
  char line [2048];
  
  hVar1 = (fp->format).format;
  if (hVar1 == sam) {
    local_858.l = 0;
    local_858.m = 0;
    local_858.s = (char *)0x0;
    bVar3 = false;
    while ((__stream = (FILE *)fp, iVar4 = hts_getline(fp,2,&fp->line), -1 < iVar4 &&
           (__stream = (FILE *)(fp->line).s, (char)__stream->_flags == '@'))) {
      uVar2 = (fp->line).l;
      if (((3 < uVar2) && (*(char *)((long)&__stream->_flags + 1) == 'S')) &&
         (*(char *)((long)&__stream->_flags + 2) == 'Q')) {
        bVar3 = true;
      }
      kputsn((char *)__stream,(int)uVar2,&local_858);
      kputc(10,&local_858);
    }
    if ((!bVar3) && (__stream = (FILE *)fp->fn_aux, __stream != (FILE *)0x0)) {
      __stream = fopen((char *)__stream,"r");
      if (__stream == (FILE *)0x0) {
        return (bam_hdr_t *)0x0;
      }
      while (pcVar6 = fgets(line,0x800,__stream), pcVar6 != (char *)0x0) {
        pcVar6 = strtok(line,"\t");
        pcVar7 = strtok((char *)0x0,"\t");
        ksprintf(&local_858,"@SQ\tSN:%s\tLN:%s\n",pcVar6,pcVar7);
      }
      fclose(__stream);
    }
    iVar4 = (int)__stream;
    if (local_858.l == 0) {
      iVar4 = 0x13a343;
      kputsn("",0,&local_858);
    }
    pbVar5 = sam_hdr_parse(iVar4,local_858.s);
    pbVar5->l_text = (uint32_t)local_858.l;
    pbVar5->text = local_858.s;
    return pbVar5;
  }
  if (hVar1 == cram) {
    pbVar5 = cram_header_to_bam(((fp->fp).cram)->header);
    return pbVar5;
  }
  if (hVar1 != bam) {
    abort();
  }
  pbVar5 = bam_hdr_read((fp->fp).bgzf);
  return pbVar5;
}

Assistant:

bam_hdr_t *sam_hdr_read(htsFile *fp)
{
    switch (fp->format.format) {
    case bam:
        return bam_hdr_read(fp->fp.bgzf);

    case cram:
        return cram_header_to_bam(fp->fp.cram->header);

    case sam: {
        kstring_t str;
        bam_hdr_t *h;
        int has_SQ = 0;
        str.l = str.m = 0; str.s = 0;
        while (hts_getline(fp, KS_SEP_LINE, &fp->line) >= 0) {
            if (fp->line.s[0] != '@') break;
            if (fp->line.l > 3 && strncmp(fp->line.s,"@SQ",3) == 0) has_SQ = 1;
            kputsn(fp->line.s, fp->line.l, &str);
            kputc('\n', &str);
        }
        if (! has_SQ && fp->fn_aux) {
            char line[2048];
            FILE *f = fopen(fp->fn_aux, "r");
            if (f == NULL) return NULL;
            while (fgets(line, sizeof line, f)) {
                const char *name = strtok(line, "\t");
                const char *length = strtok(NULL, "\t");
                ksprintf(&str, "@SQ\tSN:%s\tLN:%s\n", name, length);
            }
            fclose(f);
        }
        if (str.l == 0) kputsn("", 0, &str);
        h = sam_hdr_parse(str.l, str.s);
        h->l_text = str.l; h->text = str.s;
        return h;
        }

    default:
        abort();
    }
}